

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pass.cpp
# Opt level: O0

bool __thiscall spvtools::opt::MemPass::IsPtr(MemPass *this,uint32_t ptrId)

{
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  DefUseManager *pDVar4;
  Instruction *this_00;
  Instruction *varTypeInst;
  uint32_t varTypeId;
  Op op;
  Instruction *ptrInst;
  uint32_t varId;
  uint32_t ptrId_local;
  MemPass *this_local;
  
  pDVar4 = Pass::get_def_use_mgr(&this->super_Pass);
  _varTypeId = analysis::DefUseManager::GetDef(pDVar4,ptrId);
  OVar2 = opt::Instruction::opcode(_varTypeId);
  if (OVar2 == OpFunction) {
    this_local._7_1_ = false;
  }
  else {
    while (OVar2 = opt::Instruction::opcode(_varTypeId), OVar2 == OpCopyObject) {
      uVar3 = opt::Instruction::GetSingleWordInOperand(_varTypeId,0);
      pDVar4 = Pass::get_def_use_mgr(&this->super_Pass);
      _varTypeId = analysis::DefUseManager::GetDef(pDVar4,uVar3);
    }
    OVar2 = opt::Instruction::opcode(_varTypeId);
    if ((OVar2 == OpVariable) || (bVar1 = IsNonPtrAccessChain(this,OVar2), bVar1)) {
      this_local._7_1_ = true;
    }
    else {
      uVar3 = opt::Instruction::type_id(_varTypeId);
      if (uVar3 == 0) {
        this_local._7_1_ = false;
      }
      else {
        pDVar4 = Pass::get_def_use_mgr(&this->super_Pass);
        this_00 = analysis::DefUseManager::GetDef(pDVar4,uVar3);
        OVar2 = opt::Instruction::opcode(this_00);
        this_local._7_1_ = OVar2 == OpTypePointer;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool MemPass::IsPtr(uint32_t ptrId) {
  uint32_t varId = ptrId;
  Instruction* ptrInst = get_def_use_mgr()->GetDef(varId);
  if (ptrInst->opcode() == spv::Op::OpFunction) {
    // A function is not a pointer, but it's return type could be, which will
    // erroneously lead to this function returning true later on
    return false;
  }
  while (ptrInst->opcode() == spv::Op::OpCopyObject) {
    varId = ptrInst->GetSingleWordInOperand(kCopyObjectOperandInIdx);
    ptrInst = get_def_use_mgr()->GetDef(varId);
  }
  const spv::Op op = ptrInst->opcode();
  if (op == spv::Op::OpVariable || IsNonPtrAccessChain(op)) return true;
  const uint32_t varTypeId = ptrInst->type_id();
  if (varTypeId == 0) return false;
  const Instruction* varTypeInst = get_def_use_mgr()->GetDef(varTypeId);
  return varTypeInst->opcode() == spv::Op::OpTypePointer;
}